

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O0

Atom_p __thiscall indigox::Bond::Next(Bond *this,BondAtomIterator *it)

{
  iterator pvVar1;
  iterator pvVar2;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  shared_ptr<indigox::Atom> sVar4;
  Atom_p AVar5;
  
  *in_RDX = *in_RDX + 0x10;
  pvVar1 = (iterator)*in_RDX;
  pvVar2 = std::array<std::weak_ptr<indigox::Atom>,_2UL>::end
                     ((array<std::weak_ptr<indigox::Atom>,_2UL> *)0x10e8fa);
  if (pvVar1 == pvVar2) {
    std::shared_ptr<indigox::Atom>::shared_ptr((shared_ptr<indigox::Atom> *)0x10e911);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    sVar4 = std::weak_ptr<indigox::Atom>::lock((weak_ptr<indigox::Atom> *)in_RDI);
    _Var3 = sVar4.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  AVar5.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  AVar5.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Atom_p)AVar5.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Bond::Next(BondAtomIterator &it) {
    ++it;
    return (it == atoms_.end()) ? Atom_p() : it->lock();
  }